

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

JSON * chaiscript::json::JSONParser::parse_string
                 (JSON *__return_storage_ptr__,string *str,size_t *offset)

{
  pointer pcVar1;
  JSON *pJVar2;
  byte bVar3;
  runtime_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  long lVar6;
  ulong uVar7;
  string val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  JSON *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  size_type *local_70;
  size_type local_68;
  size_type local_60;
  undefined8 uStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  local_d8._M_string_length = 0;
  local_d8.field_2._M_local_buf[0] = '\0';
  uVar7 = *offset + 1;
  *offset = uVar7;
  local_b8 = __return_storage_ptr__;
  if (uVar7 < str->_M_string_length) {
    do {
      pcVar1 = (str->_M_dataplus)._M_p;
      bVar3 = pcVar1[uVar7];
      if (bVar3 != 0x5c) {
        if (bVar3 == 0x22) {
          *offset = uVar7 + 1;
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b0,local_d8._M_dataplus._M_p,
                     local_d8._M_dataplus._M_p + local_d8._M_string_length);
          pJVar2 = local_b8;
          JSON::JSON<std::__cxx11::string>(local_b8,&local_b0,(type *)0x0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p,
                            CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                                     local_d8.field_2._M_local_buf[0]) + 1);
          }
          return pJVar2;
        }
        goto LAB_003251f1;
      }
      uVar7 = uVar7 + 1;
      *offset = uVar7;
      if (str->_M_string_length <= uVar7) break;
      bVar3 = pcVar1[uVar7];
      if (bVar3 < 0x62) {
        if (((bVar3 != 0x22) && (bVar3 != 0x2f)) && (bVar3 != 0x5c)) goto switchD_00325251_caseD_6f;
        goto LAB_003251f1;
      }
      switch(bVar3) {
      case 0x6e:
        bVar3 = 10;
        break;
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x73:
switchD_00325251_caseD_6f:
        bVar3 = 0x5c;
        break;
      case 0x72:
        bVar3 = 0xd;
        break;
      case 0x74:
        bVar3 = 9;
        break;
      case 0x75:
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&local_d8,"\\u");
        lVar6 = 1;
        do {
          if (str->_M_string_length <= lVar6 + *offset) {
            std::__throw_out_of_range_fmt
                      ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)");
          }
          bVar3 = (str->_M_dataplus)._M_p[lVar6 + *offset];
          if ((9 < (byte)(bVar3 - 0x30)) &&
             ((0x25 < bVar3 - 0x41 || ((0x3f0000003fU >> ((ulong)(bVar3 - 0x41) & 0x3f) & 1) == 0)))
             ) {
            this = (runtime_error *)__cxa_allocate_exception(0x10);
            local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_90,
                       "JSON ERROR: String: Expected hex character in unicode escape, found \'","");
            std::operator+(&local_50,&local_90,bVar3);
            pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::append(&local_50,"\'");
            local_70 = (size_type *)(pbVar4->_M_dataplus)._M_p;
            paVar5 = &pbVar4->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70 == paVar5) {
              local_60 = paVar5->_M_allocated_capacity;
              uStack_58 = *(undefined8 *)((long)&pbVar4->field_2 + 8);
              local_70 = &local_60;
            }
            else {
              local_60 = paVar5->_M_allocated_capacity;
            }
            local_68 = pbVar4->_M_string_length;
            (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
            pbVar4->_M_string_length = 0;
            (pbVar4->field_2)._M_local_buf[0] = '\0';
            std::runtime_error::runtime_error(this,(string *)&local_70);
            __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    (&local_d8,bVar3);
          lVar6 = lVar6 + 1;
        } while (lVar6 != 5);
        *offset = *offset + 4;
        goto LAB_003251fc;
      default:
        if (bVar3 == 0x62) {
          bVar3 = 8;
        }
        else {
          if (bVar3 != 0x66) goto switchD_00325251_caseD_6f;
          bVar3 = 0xc;
        }
      }
LAB_003251f1:
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (&local_d8,bVar3);
LAB_003251fc:
      uVar7 = *offset + 1;
      *offset = uVar7;
    } while (uVar7 < str->_M_string_length);
  }
  std::__throw_out_of_range_fmt
            ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

static JSON parse_string(const std::string &str, size_t &offset) {
      std::string val;
      for (char c = str.at(++offset); c != '\"'; c = str.at(++offset)) {
        if (c == '\\') {
          switch (str.at(++offset)) {
            case '\"':
              val += '\"';
              break;
            case '\\':
              val += '\\';
              break;
            case '/':
              val += '/';
              break;
            case 'b':
              val += '\b';
              break;
            case 'f':
              val += '\f';
              break;
            case 'n':
              val += '\n';
              break;
            case 'r':
              val += '\r';
              break;
            case 't':
              val += '\t';
              break;
            case 'u': {
              val += "\\u";
              for (size_t i = 1; i <= 4; ++i) {
                c = str.at(offset + i);
                if ((c >= '0' && c <= '9') || (c >= 'a' && c <= 'f') || (c >= 'A' && c <= 'F')) {
                  val += c;
                } else {
                  throw std::runtime_error(
                      std::string("JSON ERROR: String: Expected hex character in unicode escape, found '") + c + "'");
                }
              }
              offset += 4;
            } break;
            default:
              val += '\\';
              break;
          }
        } else {
          val += c;
        }
      }
      ++offset;
      return JSON(val);
    }